

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_add_a_w_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float32 fVar1;
  int iVar2;
  float32 fVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float32 fVar8;
  int iVar9;
  
  lVar5 = (ulong)wd * 0x10;
  lVar7 = (ulong)ws * 0x10;
  lVar6 = (ulong)wt * 0x10;
  fVar8 = (env->active_fpu).fpr[ws].fs[0];
  fVar1 = (env->active_fpu).fpr[wt].fs[0];
  fVar3 = -fVar8;
  if (0 < (int)fVar8) {
    fVar3 = fVar8;
  }
  fVar8 = -fVar1;
  if (0 < (int)fVar1) {
    fVar8 = fVar1;
  }
  (env->active_fpu).fpr[wd].fs[0] = fVar8 + fVar3;
  iVar9 = *(int *)((long)(env->active_fpu).fpr + lVar7 + 4);
  iVar2 = *(int *)((long)(env->active_fpu).fpr + lVar6 + 4);
  iVar4 = -iVar9;
  if (0 < iVar9) {
    iVar4 = iVar9;
  }
  iVar9 = -iVar2;
  if (0 < iVar2) {
    iVar9 = iVar2;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar5 + 4) = iVar9 + iVar4;
  iVar9 = *(int *)((long)(env->active_fpu).fpr + lVar7 + 8);
  iVar2 = *(int *)((long)(env->active_fpu).fpr + lVar6 + 8);
  iVar4 = -iVar9;
  if (0 < iVar9) {
    iVar4 = iVar9;
  }
  iVar9 = -iVar2;
  if (0 < iVar2) {
    iVar9 = iVar2;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar5 + 8) = iVar9 + iVar4;
  iVar9 = *(int *)((long)(env->active_fpu).fpr + lVar7 + 0xc);
  iVar2 = *(int *)((long)(env->active_fpu).fpr + lVar6 + 0xc);
  iVar4 = -iVar9;
  if (0 < iVar9) {
    iVar4 = iVar9;
  }
  iVar9 = -iVar2;
  if (0 < iVar2) {
    iVar9 = iVar2;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar5 + 0xc) = iVar9 + iVar4;
  return;
}

Assistant:

void helper_msa_add_a_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_add_a_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_add_a_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_add_a_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_add_a_df(DF_WORD, pws->w[3],  pwt->w[3]);
}